

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O0

void ShowDoubleArray(double *inDoubleArray,int inSize)

{
  ostream *poVar1;
  double dVar2;
  BoxingBaseWithRW<double,_STDStreamsReader<double>,_STDStreamsWriter<double>_> local_20;
  int local_18;
  int local_14;
  int i;
  int inSize_local;
  double *inDoubleArray_local;
  
  local_14 = inSize;
  _i = inDoubleArray;
  std::operator<<((ostream *)&std::cout,"[ ");
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    BoxingBaseWithRW<double,_STDStreamsReader<double>,_STDStreamsWriter<double>_>::BoxingBaseWithRW
              (&local_20,_i + local_18);
    dVar2 = BoxingBase::operator_cast_to_double((BoxingBase *)&local_20);
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,dVar2);
    std::operator<<(poVar1," ");
  }
  std::operator<<((ostream *)&std::cout,"]");
  return;
}

Assistant:

static void ShowDoubleArray(const double inDoubleArray[],int inSize)
{
	cout<<"[ ";
	for(int i=0;i<inSize;++i)
		cout<<Double(inDoubleArray[i])<<" ";
	cout<<"]";
}